

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_image.c
# Opt level: O2

void aom_img_free(aom_image_t *img)

{
  if (img != (aom_image_t *)0x0) {
    aom_img_remove_metadata(img);
    if ((img->img_data != (uchar *)0x0) && (img->img_data_owner != 0)) {
      aom_free(img->img_data);
    }
    if (img->self_allocd != 0) {
      free(img);
      return;
    }
  }
  return;
}

Assistant:

void aom_img_free(aom_image_t *img) {
  if (img) {
    aom_img_remove_metadata(img);
    if (img->img_data && img->img_data_owner) aom_free(img->img_data);

    if (img->self_allocd) free(img);
  }
}